

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O0

void __thiscall
ArgParser::add(ArgParser *this,bool *var,string *name,string *shortName,string *description)

{
  string local_180;
  string local_150;
  string local_130;
  undefined1 local_110 [8];
  ArgHolder arg;
  string *description_local;
  string *shortName_local;
  string *name_local;
  bool *var_local;
  ArgParser *this_local;
  
  arg.validSTRING.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = description;
  std::__cxx11::string::string((string *)&local_130,(string *)name);
  std::__cxx11::string::string((string *)&local_150,(string *)shortName);
  std::__cxx11::string::string((string *)&local_180,(string *)description);
  ArgHolder::ArgHolder((ArgHolder *)local_110,&local_130,&local_150,&local_180,true);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  arg.description.field_2._12_4_ = 1;
  arg._96_8_ = var;
  std::vector<ArgHolder,_std::allocator<ArgHolder>_>::push_back
            (&this->m_args,(value_type *)local_110);
  ArgHolder::~ArgHolder((ArgHolder *)local_110);
  return;
}

Assistant:

void ArgParser::add(bool *var,
                    std::string name, std::string shortName, std::string description)
{
    ArgHolder arg(name, shortName, description, true);
    arg.varFLAG = var;
    arg.argType = ARG_FLAG;
    m_args.push_back(arg);
}